

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

bool __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_8L,_8L,_(ggml_type)8>::compute_forward
          (tensor_traits<block_q4_0,_8L,_8L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  long in_RDX;
  ggml_tensor *in_stack_00000150;
  ggml_compute_params *in_stack_00000158;
  tensor_traits<block_q4_0,_8L,_8L,_(ggml_type)8> *in_stack_00000160;
  ggml_tensor *in_stack_000001b0;
  ggml_compute_params *in_stack_000001b8;
  tensor_traits<block_q4_0,_8L,_8L,_(ggml_type)8> *in_stack_000001c0;
  undefined1 local_1;
  
  if (*(int *)(in_RDX + 0x50) == 0x1b) {
    forward_mul_mat(in_stack_00000160,in_stack_00000158,in_stack_00000150);
    local_1 = true;
  }
  else if (*(int *)(in_RDX + 0x50) == 0x1c) {
    forward_mul_mat_id(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool compute_forward(struct ggml_compute_params * params, struct ggml_tensor * op) override {
        switch (op->op) {
            case GGML_OP_MUL_MAT:
                forward_mul_mat(params, op);
                return true;
            case GGML_OP_MUL_MAT_ID:
                forward_mul_mat_id(params, op);
                return true;
            default:
                // GGML_ABORT("fatal error");
                break;
        }
        return false;
    }